

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall helics::TimeCoordinator::updateNextPossibleEventTime(TimeCoordinator *this)

{
  long lVar1;
  Time TVar2;
  Time testTime;
  
  if (this->iterating == NO_ITERATIONS) {
    TVar2 = getNextPossibleTime(this);
    (this->time_next).internalTimeCode = TVar2.internalTimeCode;
    if ((this->info).uninterruptible != false) {
      TVar2 = generateAllowedTime(this,(this->time_requested).internalTimeCode);
      goto LAB_002fc651;
    }
LAB_002fc609:
    lVar1 = (this->time_minminDe).internalTimeCode;
    if (((lVar1 != 0x7fffffffffffffff) && ((this->info).restrictive_time_policy == false)) &&
       (testTime.internalTimeCode = lVar1 + (this->info).inputDelay.internalTimeCode,
       TVar2.internalTimeCode < testTime.internalTimeCode)) {
      (this->time_next).internalTimeCode = testTime.internalTimeCode;
LAB_002fc63b:
      TVar2 = generateAllowedTime(this,testTime);
    }
  }
  else {
    TVar2.internalTimeCode = (this->time_granted).internalTimeCode;
    (this->time_next).internalTimeCode = TVar2.internalTimeCode;
    if ((this->info).uninterruptible == false) goto LAB_002fc609;
    lVar1 = (this->time_minminDe).internalTimeCode;
    if (((lVar1 != 0x7fffffffffffffff) && ((this->info).restrictive_time_policy == false)) &&
       (TVar2.internalTimeCode < lVar1 + (this->info).inputDelay.internalTimeCode)) {
      testTime.internalTimeCode = (this->time_requested).internalTimeCode;
      goto LAB_002fc63b;
    }
  }
  lVar1 = (this->time_exec).internalTimeCode;
  if (lVar1 < TVar2.internalTimeCode) {
    TVar2.internalTimeCode = lVar1;
  }
LAB_002fc651:
  (this->time_next).internalTimeCode =
       TVar2.internalTimeCode + (this->info).outputDelay.internalTimeCode;
  return;
}

Assistant:

void TimeCoordinator::updateNextPossibleEventTime()
{
    time_next =
        (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() : time_granted;

    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_next = generateAllowedTime(time_requested) + info.outputDelay;
        } else {
            if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
                if (time_minminDe + info.inputDelay > time_next) {
                    time_next = generateAllowedTime(time_requested);
                }
            }
            time_next = std::min(time_next, time_exec) + info.outputDelay;
        }
    } else {
        if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
            if (time_minminDe + info.inputDelay > time_next) {
                time_next = time_minminDe + info.inputDelay;
                time_next = generateAllowedTime(time_next);
            }
        }
        time_next = std::min(time_next, time_exec) + info.outputDelay;
    }
}